

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::Transaction::GetSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  wally_tx *tx;
  bool bVar1;
  uint uVar2;
  uint32_t sighash;
  CfdException *pCVar3;
  uchar *puVar4;
  size_type sVar5;
  ulong index;
  uint64_t satoshi;
  uchar *bytes_out;
  size_type len;
  allocator local_1e9;
  string local_1e8;
  CfdSourceLocation local_1c8 [2];
  uint local_198;
  undefined1 local_192;
  allocator local_191;
  uint32_t tx_flag;
  CfdSourceLocation local_170;
  ByteData local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx_bytedata;
  wally_tx *pwStack_118;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  undefined1 local_e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string local_c8;
  CfdSourceLocation local_a8;
  undefined1 local_8d;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_58;
  Amount *local_40;
  Amount *value_local;
  SigHashType *sighash_type_local;
  ByteData *script_data_local;
  Transaction *pTStack_20;
  uint32_t txin_index_local;
  Transaction *this_local;
  
  local_40 = value;
  value_local = (Amount *)sighash_type;
  sighash_type_local = (SigHashType *)script_data;
  script_data_local._4_4_ = txin_index;
  pTStack_20 = this;
  this_local = (Transaction *)__return_storage_ptr__;
  bVar1 = ByteData::IsEmpty(script_data);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x2f2;
    local_58.funcname = "GetSignatureHash";
    logger::warn<>(&local_58,"empty script");
    local_8d = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_78,"Failed to GetSignatureHash. empty script.",&local_79);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_78);
    local_8d = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (kVersion0 < version) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x2f7;
    local_a8.funcname = "GetSignatureHash";
    logger::warn<>(&local_a8,"unsupport witness version on ECDSA.");
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_c8,"unsupport witness version on ECDSA.",
               (allocator *)
               ((long)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_c8);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&bytes + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,0x20,
             (allocator<unsigned_char> *)((long)&bytes + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&bytes + 7));
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer,
                     (ByteData *)sighash_type_local);
  local_f8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer;
  pwStack_118 = (wally_tx *)0x0;
  tx_bytedata._4_4_ = 0;
  uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])();
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
            (&local_158,this,(ulong)(uVar2 & 1));
  ByteData::GetBytes(&local_140,&local_158);
  ByteData::~ByteData(&local_158);
  local_128 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_128);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_128);
  tx_bytedata._4_4_ = wally_tx_from_bytes(puVar4,sVar5,0,&stack0xfffffffffffffee8);
  if (tx_bytedata._4_4_ != 0) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x307;
    local_170.funcname = "GetSignatureHash";
    logger::warn<int&>(&local_170,"wally_tx_from_bytes NG[{}] ",(int *)((long)&tx_bytedata + 4));
    local_192 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&tx_flag,"transaction data invalid.",&local_191);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx_flag);
    local_192 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx_bytedata._4_4_ = -3;
  if (pwStack_118 != (wally_tx *)0x0) {
    local_198 = 0;
    if (version != kVersionNone) {
      local_198 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])();
      local_198 = local_198 & 1;
    }
    tx = pwStack_118;
    index = (ulong)script_data_local._4_4_;
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_f8);
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_f8);
    satoshi = Amount::GetSatoshiValue(local_40);
    sighash = SigHashType::GetSigHashFlag(sighash_type);
    uVar2 = local_198;
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
    tx_bytedata._4_4_ =
         wally_tx_get_btc_signature_hash(tx,index,puVar4,sVar5,satoshi,sighash,uVar2,bytes_out,len);
    wally_tx_free(pwStack_118);
  }
  if (tx_bytedata._4_4_ != 0) {
    local_1c8[0].filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_1c8[0].filename = local_1c8[0].filename + 1;
    local_1c8[0].line = 800;
    local_1c8[0].funcname = "GetSignatureHash";
    logger::warn<int&>(local_1c8,"wally_tx_get_btc_signature_hash NG[{}] ",
                       (int *)((long)&tx_bytedata + 4));
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1e8,"SignatureHash generate error.",&local_1e9);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_1e8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 Transaction::GetSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const Amount &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  if (version >= WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "unsupport witness version on ECDSA.");
    throw CfdException(
        kCfdIllegalArgumentError, "unsupport witness version on ECDSA.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret = WALLY_OK;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ret = WALLY_ENOMEM;
  if (tx_pointer != NULL) {
    try {
      uint32_t tx_flag = 0;
      if (version != WitnessVersion::kVersionNone) {
        tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
      }
      ret = wally_tx_get_btc_signature_hash(
          tx_pointer, txin_index, bytes.data(), bytes.size(),
          value.GetSatoshiValue(), sighash_type.GetSigHashFlag(), tx_flag,
          buffer.data(), buffer.size());
      wally_tx_free(tx_pointer);
    } catch (...) {
      wally_tx_free(tx_pointer);  // Separately released in case of exception
                                  // (possibility of exception by warn ())
      warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash cause exception.");
      ret = WALLY_ERROR;
    }
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_btc_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  return ByteData256(buffer);
}